

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O1

lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_handle_for<int,std::shared_timed_mutex,std::chrono::duration<long,std::ratio<1l,1000l>>>
          (lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this,
          int *obj,shared_timed_mutex *gmutex,duration<long,_std::ratio<1L,_1000L>_> *d)

{
  mutex_type *pmVar1;
  bool bVar2;
  unique_lock<std::shared_timed_mutex> *this_00;
  lock_type glock;
  unique_lock<std::shared_timed_mutex> local_40;
  unique_lock<std::shared_timed_mutex> local_30;
  unique_lock<std::shared_timed_mutex> local_20;
  
  local_40._M_device = (mutex_type *)obj;
  bVar2 = std::shared_timed_mutex::try_lock_for<long,std::ratio<1l,1000l>>
                    ((shared_timed_mutex *)obj,(duration<long,_std::ratio<1L,_1000L>_> *)gmutex);
  pmVar1 = local_40._M_device;
  if (bVar2) {
    this_00 = &local_20;
    local_20._M_device = local_40._M_device;
    __return_storage_ptr__->data = (pointer)this;
    local_20._M_owns = bVar2;
  }
  else {
    this_00 = &local_30;
    local_30._M_device = local_40._M_device;
    __return_storage_ptr__->data = (pointer)0x0;
    local_30._M_owns = bVar2;
  }
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)0x0;
  (__return_storage_ptr__->m_handle_lock)._M_device = pmVar1;
  (__return_storage_ptr__->m_handle_lock)._M_owns = bVar2;
  this_00->_M_device = (mutex_type *)0x0;
  this_00->_M_owns = false;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(this_00);
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle_for(T* obj, M& gmutex, const Duration& d)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, d);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}